

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

bool i4_is_power_of_10(int n)

{
  bool bVar1;
  bool bVar2;
  
  if (n < 1) {
    bVar2 = false;
  }
  else {
    do {
      bVar2 = (uint)n < 2;
      if ((uint)n % 10 != 0) {
        return bVar2;
      }
      bVar1 = 1 < (uint)n;
      n = (uint)n / 10;
    } while (bVar1);
  }
  return bVar2;
}

Assistant:

bool i4_is_power_of_10 ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    I4_IS_POWER_OF_10 reports whether an I4 is a power of 10.
//
//  Discussion:
//
//    The powers of 10 are 1, 10, 100, 1000, 10000, and so on.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 March 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the integer to be tested.
//
//    Output, bool I4_IS_POWER_OF_10, is TRUE if N is a power of 10.
//
{
  bool value;

  if ( n <= 0 )
  {
    value = false;
    return value;
  }

  while ( 1 < n )
  {
    if ( ( n % 10 ) != 0 )
    {
      value = false;
      return value;
    }
    n = n / 10;
  }

  value = true;

  return value;
}